

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptTypes.h
# Opt level: O2

ValueDict * __thiscall MiniScript::Value::GetDict(ValueDict *__return_storage_ptr__,Value *this)

{
  DictionaryStorage<MiniScript::Value,_MiniScript::Value> *this_00;
  
  _ErrorIf((uint)(this->type != Map),"Assert failed: type == ValueType::Map",
           "/workspace/llm4binary/github/license_c_cmakelists/JoeStrout[P]miniscript/MiniScript-cpp/src/MiniScript/MiniscriptTypes.h"
           ,0x95);
  this_00 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)(this->data).ref;
  if (this_00 == (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)0x0) {
    this_00 = (DictionaryStorage<MiniScript::Value,_MiniScript::Value> *)operator_new(0x800);
    DictionaryStorage<MiniScript::Value,_MiniScript::Value>::DictionaryStorage(this_00);
    (this->data).ref = (RefCountedStorage *)this_00;
  }
  Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::Dictionary
            (__return_storage_ptr__,this_00,true);
  Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::retain
            (__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

ValueDict GetDict() { Assert(type == ValueType::Map); if (not data.ref) data.ref = new ValueDictStorage(); ValueDict d((ValueDictStorage*)(data.ref)); d.retain(); return d; }